

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O0

ScalarFunctionSet * duckdb::RightShiftFun::GetFunctions(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  initializer_list<duckdb::LogicalType> iVar2;
  bool bVar3;
  ScalarFunctionSet *in_RDI;
  ScalarFunction *function;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::ScalarFunction,_true> *__range1_1;
  LogicalType *type;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::LogicalType,_true> *__range1;
  ScalarFunctionSet *functions;
  ScalarFunction *in_stack_fffffffffffffa48;
  ScalarFunction *function_00;
  ScalarFunction *in_stack_fffffffffffffa50;
  ScalarFunction *this;
  LogicalType *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  LogicalType *local_550;
  LogicalType *in_stack_fffffffffffffaf8;
  BaseScalarFunction local_4e8 [176];
  reference local_438;
  ScalarFunction *local_430;
  __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
  local_428;
  ScalarFunctionSet *local_420;
  LogicalType local_418 [24];
  undefined1 local_400 [32];
  LogicalType local_3e0 [32];
  LogicalType *local_3c0;
  LogicalType local_3b8 [24];
  LogicalType local_3a0 [24];
  LogicalType *local_388;
  undefined8 local_380;
  undefined1 local_378 [24];
  ScalarFunction local_360;
  LogicalType local_238 [24];
  undefined1 local_220 [32];
  LogicalType local_200 [32];
  LogicalType *local_1e0;
  LogicalType local_1d8 [24];
  LogicalType local_1c0 [24];
  LogicalType *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [24];
  ScalarFunction local_180;
  LogicalType *local_58;
  LogicalType *local_50;
  __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
  local_48 [3];
  undefined1 local_30 [24];
  undefined1 *local_18;
  undefined1 local_9;
  
  local_9 = 0;
  duckdb::ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  duckdb::LogicalType::Integral();
  local_18 = local_30;
  local_48[0]._M_current =
       (LogicalType *)
       std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::begin
                 ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                  in_stack_fffffffffffffa48);
  local_50 = (LogicalType *)
             std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::end
                       ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                        in_stack_fffffffffffffa48);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffa50,
                            (__normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
                             *)in_stack_fffffffffffffa48), bVar3) {
    local_58 = __gnu_cxx::
               __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
               ::operator*(local_48);
    local_1e0 = local_1d8;
    duckdb::LogicalType::LogicalType(local_1e0,local_58);
    local_1e0 = local_1c0;
    duckdb::LogicalType::LogicalType(local_1e0,local_58);
    local_1a8 = local_1d8;
    local_1a0 = 2;
    std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe31510);
    iVar1._M_len._0_4_ = in_stack_fffffffffffffa60;
    iVar1._M_array = in_stack_fffffffffffffa58;
    iVar1._M_len._4_4_ = in_stack_fffffffffffffa64;
    vector<duckdb::LogicalType,_true>::vector
              ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa50,iVar1,
               (allocator_type *)in_stack_fffffffffffffa48);
    duckdb::LogicalType::LogicalType(local_200,local_58);
    GetScalarIntegerBinaryFunction<duckdb::BitwiseShiftRightOperator>(in_stack_fffffffffffffaf8);
    duckdb::LogicalType::LogicalType(local_238,INVALID);
    in_stack_fffffffffffffa58 = local_238;
    in_stack_fffffffffffffa60 = 0;
    in_stack_fffffffffffffa50 = (ScalarFunction *)0x0;
    in_stack_fffffffffffffa48 = (ScalarFunction *)0x0;
    duckdb::ScalarFunction::ScalarFunction(&local_180,local_198,local_200,local_220,0);
    FunctionSet<duckdb::ScalarFunction>::AddFunction
              ((FunctionSet<duckdb::ScalarFunction> *)in_stack_fffffffffffffa50,
               in_stack_fffffffffffffa48);
    ScalarFunction::~ScalarFunction(in_stack_fffffffffffffa50);
    duckdb::LogicalType::~LogicalType(local_238);
    std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::
    ~function((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
              0xe31617);
    duckdb::LogicalType::~LogicalType(local_200);
    vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe31631);
    std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe3163e);
    in_stack_fffffffffffffaf8 = (LogicalType *)&local_1a8;
    do {
      in_stack_fffffffffffffaf8 = in_stack_fffffffffffffaf8 + -0x18;
      duckdb::LogicalType::~LogicalType(in_stack_fffffffffffffaf8);
    } while (in_stack_fffffffffffffaf8 != local_1d8);
    __gnu_cxx::
    __normal_iterator<const_duckdb::LogicalType_*,_std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>_>
    ::operator++(local_48);
  }
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe3146e);
  local_3c0 = local_3b8;
  duckdb::LogicalType::LogicalType(local_3c0,BIT);
  local_3c0 = local_3a0;
  duckdb::LogicalType::LogicalType(local_3c0,INTEGER);
  local_388 = local_3b8;
  local_380 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xe318ac);
  iVar2._M_len._0_4_ = in_stack_fffffffffffffa60;
  iVar2._M_array = in_stack_fffffffffffffa58;
  iVar2._M_len._4_4_ = in_stack_fffffffffffffa64;
  vector<duckdb::LogicalType,_true>::vector
            ((vector<duckdb::LogicalType,_true> *)in_stack_fffffffffffffa50,iVar2,
             (allocator_type *)in_stack_fffffffffffffa48);
  duckdb::LogicalType::LogicalType(local_3e0,BIT);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
             (_func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *)in_stack_fffffffffffffa58);
  duckdb::LogicalType::LogicalType(local_418,INVALID);
  this = (ScalarFunction *)0x0;
  function_00 = (ScalarFunction *)0x0;
  duckdb::ScalarFunction::ScalarFunction(&local_360,local_378,local_3e0,local_400,0);
  FunctionSet<duckdb::ScalarFunction>::AddFunction
            ((FunctionSet<duckdb::ScalarFunction> *)this,function_00);
  ScalarFunction::~ScalarFunction(this);
  duckdb::LogicalType::~LogicalType(local_418);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe319aa);
  duckdb::LogicalType::~LogicalType(local_3e0);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe319c4);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xe319d1);
  local_550 = (LogicalType *)&local_388;
  do {
    local_550 = local_550 + -0x18;
    duckdb::LogicalType::~LogicalType(local_550);
  } while (local_550 != local_3b8);
  local_420 = in_RDI + 0x20;
  local_428._M_current =
       (ScalarFunction *)
       std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::begin
                 (function_00);
  local_430 = (ScalarFunction *)
              std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::end
                        ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                         function_00);
  while (bVar3 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                             *)this,(__normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                                     *)function_00), bVar3) {
    local_438 = __gnu_cxx::
                __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
                ::operator*(&local_428);
    BaseScalarFunction::SetReturnsError(&function_00->super_BaseScalarFunction);
    duckdb::BaseScalarFunction::~BaseScalarFunction(local_4e8);
    __gnu_cxx::
    __normal_iterator<duckdb::ScalarFunction_*,_std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>_>
    ::operator++(&local_428);
  }
  return in_RDI;
}

Assistant:

ScalarFunctionSet RightShiftFun::GetFunctions() {
	ScalarFunctionSet functions;
	for (auto &type : LogicalType::Integral()) {
		functions.AddFunction(
		    ScalarFunction({type, type}, type, GetScalarIntegerBinaryFunction<BitwiseShiftRightOperator>(type)));
	}
	functions.AddFunction(
	    ScalarFunction({LogicalType::BIT, LogicalType::INTEGER}, LogicalType::BIT, BitwiseShiftRightOperation));
	for (auto &function : functions.functions) {
		BaseScalarFunction::SetReturnsError(function);
	}
	return functions;
}